

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Vector<flatbuffers::Offset64<void>,unsigned_int>,unsigned_int>
          (JsonPrinter *this,uint *param_2,uint param_3,Type *param_4,int param_5,uint8_t *param_6)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint *val;
  ulong uVar4;
  int iVar5;
  uint *puVar6;
  bool bVar7;
  
  cVar1 = '\0';
  if (param_4->base_type == BASE_TYPE_STRUCT) {
    cVar1 = param_4->struct_def->fixed;
  }
  iVar2 = this->opts->indent_step;
  iVar5 = 0;
  if (0 < iVar2) {
    iVar5 = iVar2;
  }
  std::__cxx11::string::push_back((char)this->text);
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  bVar7 = param_3 != 0;
  pcVar3 = (char *)(ulong)param_3;
  if (bVar7) {
    uVar4 = 0;
    puVar6 = param_2 + 1;
    do {
      if (uVar4 != 0) {
        if (this->opts->protobuf_ascii_alike == false) {
          std::__cxx11::string::push_back((char)this->text);
        }
        if (-1 < this->opts->indent_step) {
          std::__cxx11::string::push_back((char)this->text);
        }
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)this->text,this->text->_M_string_length,0,(char)(iVar5 + param_5));
      if (cVar1 == '\0') {
        if (*param_2 <= uVar4) {
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<flatbuffers::Offset64<>>::Get(SizeT) const [T = flatbuffers::Offset64<>, SizeT = unsigned int]"
                       );
        }
        val = (uint *)(*(long *)puVar6 + (long)puVar6);
      }
      else {
        val = (uint *)(param_4->struct_def->bytesize * uVar4 + (long)(param_2 + 1));
      }
      pcVar3 = PrintOffset(this,val,param_4,iVar5 + param_5,param_6,(soffset_t)uVar4);
      if (pcVar3 != (char *)0x0) break;
      uVar4 = uVar4 + 1;
      bVar7 = uVar4 < param_3;
      puVar6 = puVar6 + 2;
      pcVar3 = (char *)(ulong)param_3;
    } while (param_3 != uVar4);
  }
  if (!bVar7) {
    if (-1 < this->opts->indent_step) {
      std::__cxx11::string::push_back((char)this->text);
    }
    pcVar3 = (char *)0x0;
    std::__cxx11::string::_M_replace_aux
              ((ulong)this->text,this->text->_M_string_length,0,(char)param_5);
    std::__cxx11::string::push_back((char)this->text);
  }
  return pcVar3;
}

Assistant:

const char *PrintContainer(PrintPointerTag, const Container &c, SizeT size,
                             const Type &type, int indent,
                             const uint8_t *prev_val) {
    const auto is_struct = IsStruct(type);
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      auto ptr = is_struct ? reinterpret_cast<const void *>(
                                 c.Data() + type.struct_def->bytesize * i)
                           : c[i];
      auto err = PrintOffset(ptr, type, elem_indent, prev_val,
                             static_cast<soffset_t>(i));
      if (err) return err;
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }